

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O1

Object * __thiscall flatbuffers::BinaryAnnotator::RootTable(BinaryAnnotator *this)

{
  size_type sVar1;
  pointer pcVar2;
  uint8_t *offset_location;
  uint *puVar3;
  ushort uVar4;
  long lVar5;
  Schema *pSVar6;
  Object *pOVar7;
  unsigned_short vtsize;
  long *local_38 [2];
  long local_28 [2];
  
  pSVar6 = this->schema_;
  sVar1 = (this->root_table_)._M_string_length;
  lVar5 = -(long)*(int *)pSVar6;
  if (sVar1 == 0) {
    if (*(ushort *)(pSVar6 + -(long)*(int *)pSVar6) < 0xd) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(ushort *)(pSVar6 + lVar5 + 0xc);
    }
    if (uVar4 == 0) {
      pOVar7 = (Object *)0x0;
    }
    else {
      pOVar7 = (Object *)(pSVar6 + (ulong)*(uint *)(pSVar6 + uVar4) + (ulong)uVar4);
    }
  }
  else {
    if (*(ushort *)(pSVar6 + -(long)*(int *)pSVar6) < 5) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(ushort *)(pSVar6 + lVar5 + 4);
    }
    if (uVar4 == 0) {
      pSVar6 = (Schema *)0x0;
    }
    else {
      pSVar6 = pSVar6 + (ulong)*(uint *)(pSVar6 + uVar4) + (ulong)uVar4;
    }
    pcVar2 = (this->root_table_)._M_dataplus._M_p;
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char*>((string *)local_38,pcVar2,pcVar2 + sVar1);
    puVar3 = (uint *)bsearch(local_38,pSVar6 + 4,(ulong)*(uint *)pSVar6,4,
                             Vector<flatbuffers::Offset<reflection::Object>,unsigned_int>::
                             KeyCompare<std::__cxx11::string>);
    if (puVar3 == (uint *)0x0) {
      pOVar7 = (Object *)0x0;
    }
    else {
      pOVar7 = (Object *)((ulong)*puVar3 + (long)puVar3);
    }
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  return pOVar7;
}

Assistant:

const reflection::Object *BinaryAnnotator::RootTable() const {
  if (!root_table_.empty()) {
    return schema_->objects()->LookupByKey(root_table_);
  }
  return schema_->root_table();
}